

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

bool btSolveDantzigLCP(int n,btScalar *A,btScalar *x,btScalar *b,btScalar *outer_w,int nub,
                      btScalar *lo,btScalar *hi,int *findex,btDantzigScratchMemory *scratchMem)

{
  float fVar1;
  float *pfVar2;
  int *piVar3;
  bool *ptr;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  undefined1 uVar7;
  float *pfVar8;
  void *pvVar9;
  int *piVar10;
  bool *_state;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int nskip;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  size_t __n;
  long lVar19;
  btScalar bVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  btLCP lcp;
  
  s_error = false;
  if (n <= nub) {
    btFactorLDLT(A,outer_w,n,n);
    btSolveLDLT(A,outer_w,b,n,n);
    memcpy(x,b,(long)n << 2);
    goto LAB_001cd9ad;
  }
  uVar17 = n * n;
  uVar18 = (scratchMem->L).m_size;
  if ((int)uVar18 < (int)uVar17) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->L).m_capacity < (int)uVar17) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((ulong)uVar17 * 4,0x10);
        uVar18 = (scratchMem->L).m_size;
      }
      pfVar2 = (scratchMem->L).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccb19;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccb19:
        if ((scratchMem->L).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->L).m_ownsMemory = true;
      (scratchMem->L).m_data = pfVar8;
      (scratchMem->L).m_capacity = uVar17;
    }
    else {
      pfVar8 = (scratchMem->L).m_data;
    }
    memset(pfVar8 + lVar19,0,((ulong)uVar17 - lVar19) * 4);
  }
  (scratchMem->L).m_size = uVar17;
  uVar18 = (scratchMem->d).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->d).m_capacity < n) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->d).m_size;
      }
      pfVar2 = (scratchMem->d).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccbd2;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccbd2:
        if ((scratchMem->d).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->d).m_ownsMemory = true;
      (scratchMem->d).m_data = pfVar8;
      (scratchMem->d).m_capacity = n;
    }
    else {
      pfVar8 = (scratchMem->d).m_data;
    }
    memset(pfVar8 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->d).m_size = n;
  uVar18 = (scratchMem->delta_w).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->delta_w).m_capacity < n) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->delta_w).m_size;
      }
      pfVar2 = (scratchMem->delta_w).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccc76;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccc76:
        if ((scratchMem->delta_w).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->delta_w).m_ownsMemory = true;
      (scratchMem->delta_w).m_data = pfVar8;
      (scratchMem->delta_w).m_capacity = n;
    }
    else {
      pfVar8 = (scratchMem->delta_w).m_data;
    }
    memset(pfVar8 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->delta_w).m_size = n;
  uVar18 = (scratchMem->delta_x).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->delta_x).m_capacity < n) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->delta_x).m_size;
      }
      pfVar2 = (scratchMem->delta_x).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccd29;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccd29:
        if ((scratchMem->delta_x).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->delta_x).m_ownsMemory = true;
      (scratchMem->delta_x).m_data = pfVar8;
      (scratchMem->delta_x).m_capacity = n;
    }
    else {
      pfVar8 = (scratchMem->delta_x).m_data;
    }
    memset(pfVar8 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->delta_x).m_size = n;
  uVar18 = (scratchMem->Dell).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->Dell).m_capacity < n) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->Dell).m_size;
      }
      pfVar2 = (scratchMem->Dell).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccdeb;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccdeb:
        if ((scratchMem->Dell).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->Dell).m_ownsMemory = true;
      (scratchMem->Dell).m_data = pfVar8;
      (scratchMem->Dell).m_capacity = n;
    }
    else {
      pfVar8 = (scratchMem->Dell).m_data;
    }
    memset(pfVar8 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->Dell).m_size = n;
  uVar18 = (scratchMem->ell).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->ell).m_capacity < n) {
      if (n == 0) {
        pfVar8 = (float *)0x0;
      }
      else {
        pfVar8 = (float *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->ell).m_size;
      }
      pfVar2 = (scratchMem->ell).m_data;
      if ((int)uVar18 < 1) {
        if (pfVar2 != (float *)0x0) goto LAB_001ccead;
      }
      else {
        uVar12 = 0;
        do {
          pfVar8[uVar12] = pfVar2[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001ccead:
        if ((scratchMem->ell).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
      }
      (scratchMem->ell).m_ownsMemory = true;
      (scratchMem->ell).m_data = pfVar8;
      (scratchMem->ell).m_capacity = n;
    }
    else {
      pfVar8 = (scratchMem->ell).m_data;
    }
    memset(pfVar8 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->ell).m_size = n;
  uVar18 = *(uint *)&scratchMem->field_0xe4;
  if ((int)uVar18 < n) {
    if (*(int *)&scratchMem->field_0xe8 < n) {
      if (n == 0) {
        pvVar9 = (void *)0x0;
        uVar17 = uVar18;
      }
      else {
        pvVar9 = btAlignedAllocInternal((long)n << 3,0x10);
        uVar17 = *(uint *)&scratchMem->field_0xe4;
      }
      if (0 < (int)uVar17) {
        uVar12 = 0;
        do {
          *(undefined8 *)((long)pvVar9 + uVar12 * 8) =
               *(undefined8 *)(*(long *)&scratchMem->field_0xf0 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar17 != uVar12);
      }
      if ((*(void **)&scratchMem->field_0xf0 != (void *)0x0) && (scratchMem->field_0xf8 == '\x01'))
      {
        btAlignedFreeInternal(*(void **)&scratchMem->field_0xf0);
      }
      scratchMem->field_0xf8 = 1;
      *(void **)&scratchMem->field_0xf0 = pvVar9;
      *(int *)&scratchMem->field_0xe8 = n;
    }
    lVar19 = (long)(int)uVar18;
    do {
      *(undefined8 *)(*(long *)&scratchMem->field_0xf0 + lVar19 * 8) = 0;
      lVar19 = lVar19 + 1;
    } while (n != lVar19);
  }
  *(int *)&scratchMem->field_0xe4 = n;
  uVar18 = (scratchMem->p).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->p).m_capacity < n) {
      if (n == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->p).m_size;
      }
      piVar3 = (scratchMem->p).m_data;
      if ((int)uVar18 < 1) {
        if (piVar3 != (int *)0x0) goto LAB_001cd031;
      }
      else {
        uVar12 = 0;
        do {
          piVar10[uVar12] = piVar3[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001cd031:
        if ((scratchMem->p).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar3);
        }
      }
      (scratchMem->p).m_ownsMemory = true;
      (scratchMem->p).m_data = piVar10;
      (scratchMem->p).m_capacity = n;
    }
    else {
      piVar10 = (scratchMem->p).m_data;
    }
    memset(piVar10 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->p).m_size = n;
  uVar18 = (scratchMem->C).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->C).m_capacity < n) {
      if (n == 0) {
        piVar10 = (int *)0x0;
      }
      else {
        piVar10 = (int *)btAlignedAllocInternal((long)n << 2,0x10);
        uVar18 = (scratchMem->C).m_size;
      }
      piVar3 = (scratchMem->C).m_data;
      if ((int)uVar18 < 1) {
        if (piVar3 != (int *)0x0) goto LAB_001cd0ef;
      }
      else {
        uVar12 = 0;
        do {
          piVar10[uVar12] = piVar3[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001cd0ef:
        if ((scratchMem->C).m_ownsMemory == true) {
          btAlignedFreeInternal(piVar3);
        }
      }
      (scratchMem->C).m_ownsMemory = true;
      (scratchMem->C).m_data = piVar10;
      (scratchMem->C).m_capacity = n;
    }
    else {
      piVar10 = (scratchMem->C).m_data;
    }
    memset(piVar10 + lVar19,0,(n - lVar19) * 4);
  }
  (scratchMem->C).m_size = n;
  uVar18 = (scratchMem->state).m_size;
  if ((int)uVar18 < n) {
    lVar19 = (long)(int)uVar18;
    if ((scratchMem->state).m_capacity < n) {
      if (n == 0) {
        _state = (bool *)0x0;
      }
      else {
        _state = (bool *)btAlignedAllocInternal((long)n,0x10);
        uVar18 = (scratchMem->state).m_size;
      }
      ptr = (scratchMem->state).m_data;
      if ((int)uVar18 < 1) {
        if (ptr != (bool *)0x0) goto LAB_001cd1af;
      }
      else {
        uVar12 = 0;
        do {
          _state[uVar12] = ptr[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar18 != uVar12);
LAB_001cd1af:
        if ((scratchMem->state).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
      }
      (scratchMem->state).m_ownsMemory = true;
      (scratchMem->state).m_data = _state;
      (scratchMem->state).m_capacity = n;
    }
    else {
      _state = (scratchMem->state).m_data;
    }
    memset(_state + lVar19,0,n - lVar19);
  }
  else {
    _state = (scratchMem->state).m_data;
  }
  (scratchMem->state).m_size = n;
  btLCP::btLCP(&lcp,n,n,nub,A,x,b,outer_w,lo,hi,(scratchMem->L).m_data,(scratchMem->d).m_data,
               (scratchMem->Dell).m_data,(scratchMem->ell).m_data,(scratchMem->delta_w).m_data,
               _state,findex,(scratchMem->p).m_data,(scratchMem->C).m_data,
               *(btScalar ***)&scratchMem->field_0xf0);
  lVar19 = (long)lcp.m_nub;
  if (lcp.m_nub < n) {
    bVar6 = false;
    lVar14 = lVar19;
    do {
      s_error = false;
      if (findex != (int *)0x0 && !bVar6) {
        if (findex[lVar14] < 0) {
          bVar6 = false;
        }
        else {
          if (0 < n) {
            pfVar8 = (scratchMem->delta_w).m_data;
            piVar10 = (scratchMem->p).m_data;
            uVar12 = 0;
            do {
              pfVar8[piVar10[uVar12]] = x[uVar12];
              uVar12 = uVar12 + 1;
            } while ((uint)n != uVar12);
          }
          pfVar8 = (scratchMem->delta_w).m_data;
          lVar13 = lVar14;
          do {
            fVar22 = pfVar8[findex[lVar13]];
            if ((fVar22 != 0.0) || (NAN(fVar22))) {
              fVar1 = hi[lVar13];
              hi[lVar13] = ABS(fVar22 * fVar1);
              bVar20 = (btScalar)((uint)(fVar22 * fVar1) | 0x80000000);
            }
            else {
              hi[lVar13] = 0.0;
              bVar20 = 0.0;
            }
            lo[lVar13] = bVar20;
            lVar13 = lVar13 + 1;
          } while (lVar13 < n);
          bVar6 = true;
        }
      }
      iVar11 = (int)lVar14;
      bVar20 = btLCP::AiC_times_qC(&lcp,iVar11,x);
      bVar21 = btLCP::AiN_times_qN(&lcp,iVar11,x);
      fVar22 = (bVar21 + bVar20) - b[lVar14];
      outer_w[lVar14] = fVar22;
      if (((lo[lVar14] != 0.0) || (NAN(lo[lVar14]))) || (fVar22 < 0.0)) {
        if (((hi[lVar14] != 0.0) || (NAN(hi[lVar14]))) || (0.0 < fVar22)) {
          if ((fVar22 != 0.0) || (NAN(fVar22))) {
            pfVar8 = outer_w + lVar14;
            pfVar2 = x + lVar14;
            uVar18 = -(uint)(0.0 < fVar22) | 1;
            btLCP::solve1(&lcp,(scratchMem->delta_x).m_data,iVar11,uVar18,0);
            btLCP::pN_equals_ANC_times_qC
                      (&lcp,(scratchMem->delta_w).m_data,(scratchMem->delta_x).m_data);
            btLCP::pN_plusequals_ANi(&lcp,(scratchMem->delta_w).m_data,iVar11,uVar18);
            bVar20 = btLCP::AiC_times_qC(&lcp,iVar11,(scratchMem->delta_x).m_data);
            fVar1 = *(float *)(&DAT_001eff08 + (ulong)(0.0 >= fVar22) * 4);
            fVar23 = lcp.m_A[lVar14][lVar14] * fVar1 + bVar20;
            pfVar4 = (scratchMem->delta_w).m_data;
            pfVar4[lVar14] = fVar23;
            fVar23 = -*pfVar8 / fVar23;
            if (0.0 < fVar22) {
              if (lo[lVar14] != -INFINITY) {
                fVar24 = -(lo[lVar14] - *pfVar2);
                fVar22 = fVar24;
                if (fVar23 <= fVar24) {
                  fVar22 = fVar23;
                }
                uVar18 = (uint)(fVar24 < fVar23);
                goto LAB_001cd608;
              }
LAB_001cd60d:
              iVar11 = 1;
            }
            else {
              if (hi[lVar14] == INFINITY) goto LAB_001cd60d;
              fVar24 = hi[lVar14] - *pfVar2;
              fVar22 = fVar24;
              if (fVar23 <= fVar24) {
                fVar22 = fVar23;
              }
              uVar18 = (uint)(fVar24 < fVar23) * 2;
LAB_001cd608:
              iVar11 = uVar18 + 1;
              fVar23 = fVar22;
            }
            lVar13 = (long)lcp.m_nN;
            lVar16 = (long)lcp.m_nC;
            if (0 < lVar13) {
              lVar15 = 0;
              do {
                fVar22 = pfVar4[lVar16 + lVar15];
                if ((scratchMem->state).m_data[lVar15 + lVar16] == false) {
                  if (fVar22 < 0.0) goto LAB_001cd67c;
                }
                else if (0.0 < fVar22) {
LAB_001cd67c:
                  if (((((lo[lVar16 + lVar15] != 0.0) || (NAN(lo[lVar16 + lVar15]))) ||
                       (hi[lVar16 + lVar15] != 0.0)) || (NAN(hi[lVar16 + lVar15]))) &&
                     (-outer_w[lVar16 + lVar15] / fVar22 < fVar23)) {
                    iVar11 = 4;
                    fVar23 = -outer_w[lVar16 + lVar15] / fVar22;
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar13 != lVar15);
            }
            if (lcp.m_nub < lcp.m_nC) {
              lVar15 = 0;
              do {
                fVar22 = (scratchMem->delta_x).m_data[lVar19 + lVar15];
                fVar24 = fVar23;
                if ((fVar22 < 0.0) && (lo[lVar19 + lVar15] != -INFINITY)) {
                  fVar25 = (lo[lVar19 + lVar15] - x[lVar19 + lVar15]) / fVar22;
                  fVar24 = fVar25;
                  if (fVar23 <= fVar25) {
                    fVar24 = fVar23;
                  }
                  if (fVar25 < fVar23) {
                    iVar11 = 5;
                  }
                }
                fVar23 = fVar24;
                if ((0.0 < fVar22) && (hi[lVar19 + lVar15] != INFINITY)) {
                  fVar22 = (hi[lVar19 + lVar15] - x[lVar19 + lVar15]) / fVar22;
                  fVar23 = fVar22;
                  if (fVar24 <= fVar22) {
                    fVar23 = fVar24;
                  }
                  if (fVar22 < fVar24) {
                    iVar11 = 6;
                  }
                }
                lVar15 = lVar15 + 1;
              } while (lVar16 - lVar19 != lVar15);
            }
            if (0.0 < fVar23) {
              if (0 < lcp.m_nC) {
                pfVar5 = (scratchMem->delta_x).m_data;
                lVar19 = 0;
                do {
                  x[lVar19] = pfVar5[lVar19] * fVar23 + x[lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar16 != lVar19);
              }
              *pfVar2 = fVar1 * fVar23 + *pfVar2;
              if (0 < lcp.m_nN) {
                lVar19 = 0;
                do {
                  outer_w[lVar16 + lVar19] =
                       pfVar4[lVar16 + lVar19] * fVar23 + outer_w[lVar16 + lVar19];
                  lVar19 = lVar19 + 1;
                } while (lVar13 != lVar19);
              }
              *pfVar8 = fVar23 * pfVar4[lVar14] + *pfVar8;
              uVar7 = (*(code *)(&DAT_001f2364 + *(int *)(&DAT_001f2364 + (ulong)(iVar11 - 1) * 4)))
                                ();
              return (bool)uVar7;
            }
            __n = (n - lVar14) * 4;
            memset(pfVar2,0,__n);
            memset(pfVar8,0,__n);
            s_error = true;
          }
          else {
            btLCP::solve1(&lcp,(scratchMem->delta_x).m_data,iVar11,0,1);
            btLCP::transfer_i_to_C(&lcp,iVar11);
          }
        }
        else {
          lcp.m_nN = lcp.m_nN + 1;
          (scratchMem->state).m_data[lVar14] = true;
        }
      }
      else {
        lcp.m_nN = lcp.m_nN + 1;
        (scratchMem->state).m_data[lVar14] = false;
      }
    } while ((s_error == false) && (lVar14 = lVar14 + 1, (int)lVar14 != n));
  }
  btLCP::unpermute(&lcp);
LAB_001cd9ad:
  return (bool)(s_error ^ 1);
}

Assistant:

bool btSolveDantzigLCP (int n, btScalar *A, btScalar *x, btScalar *b,
                btScalar* outer_w, int nub, btScalar *lo, btScalar *hi, int *findex, btDantzigScratchMemory& scratchMem)
{
	s_error = false;

//	printf("btSolveDantzigLCP n=%d\n",n);
  btAssert (n>0 && A && x && b && lo && hi && nub >= 0 && nub <= n);
  btAssert(outer_w);

#ifdef BT_DEBUG
  {
    // check restrictions on lo and hi
    for (int k=0; k<n; ++k) 
		btAssert (lo[k] <= 0 && hi[k] >= 0);
  }
# endif


  // if all the variables are unbounded then we can just factor, solve,
  // and return
  if (nub >= n) 
  {
   

    int nskip = (n);
    btFactorLDLT (A, outer_w, n, nskip);
    btSolveLDLT (A, outer_w, b, n, nskip);
    memcpy (x, b, n*sizeof(btScalar));

    return !s_error;
  }

  const int nskip = (n);
  scratchMem.L.resize(n*nskip);

  scratchMem.d.resize(n);

  btScalar *w = outer_w;
  scratchMem.delta_w.resize(n);
  scratchMem.delta_x.resize(n);
  scratchMem.Dell.resize(n);
  scratchMem.ell.resize(n);
  scratchMem.Arows.resize(n);
  scratchMem.p.resize(n);
  scratchMem.C.resize(n);

  // for i in N, state[i] is 0 if x(i)==lo(i) or 1 if x(i)==hi(i)
  scratchMem.state.resize(n);


  // create LCP object. note that tmp is set to delta_w to save space, this
  // optimization relies on knowledge of how tmp is used, so be careful!
  btLCP lcp(n,nskip,nub,A,x,b,w,lo,hi,&scratchMem.L[0],&scratchMem.d[0],&scratchMem.Dell[0],&scratchMem.ell[0],&scratchMem.delta_w[0],&scratchMem.state[0],findex,&scratchMem.p[0],&scratchMem.C[0],&scratchMem.Arows[0]);
  int adj_nub = lcp.getNub();

  // loop over all indexes adj_nub..n-1. for index i, if x(i),w(i) satisfy the
  // LCP conditions then i is added to the appropriate index set. otherwise
  // x(i),w(i) is driven either +ve or -ve to force it to the valid region.
  // as we drive x(i), x(C) is also adjusted to keep w(C) at zero.
  // while driving x(i) we maintain the LCP conditions on the other variables
  // 0..i-1. we do this by watching out for other x(i),w(i) values going
  // outside the valid region, and then switching them between index sets
  // when that happens.

  bool hit_first_friction_index = false;
  for (int i=adj_nub; i<n; ++i) 
  {
    s_error = false;
    // the index i is the driving index and indexes i+1..n-1 are "dont care",
    // i.e. when we make changes to the system those x's will be zero and we
    // don't care what happens to those w's. in other words, we only consider
    // an (i+1)*(i+1) sub-problem of A*x=b+w.

    // if we've hit the first friction index, we have to compute the lo and
    // hi values based on the values of x already computed. we have been
    // permuting the indexes, so the values stored in the findex vector are
    // no longer valid. thus we have to temporarily unpermute the x vector. 
    // for the purposes of this computation, 0*infinity = 0 ... so if the
    // contact constraint's normal force is 0, there should be no tangential
    // force applied.

    if (!hit_first_friction_index && findex && findex[i] >= 0) {
      // un-permute x into delta_w, which is not being used at the moment
      for (int j=0; j<n; ++j) scratchMem.delta_w[scratchMem.p[j]] = x[j];

      // set lo and hi values
      for (int k=i; k<n; ++k) {
        btScalar wfk = scratchMem.delta_w[findex[k]];
        if (wfk == 0) {
          hi[k] = 0;
          lo[k] = 0;
        }
        else {
          hi[k] = btFabs (hi[k] * wfk);
          lo[k] = -hi[k];
        }
      }
      hit_first_friction_index = true;
    }

    // thus far we have not even been computing the w values for indexes
    // greater than i, so compute w[i] now.
    w[i] = lcp.AiC_times_qC (i,x) + lcp.AiN_times_qN (i,x) - b[i];

    // if lo=hi=0 (which can happen for tangential friction when normals are
    // 0) then the index will be assigned to set N with some state. however,
    // set C's line has zero size, so the index will always remain in set N.
    // with the "normal" switching logic, if w changed sign then the index
    // would have to switch to set C and then back to set N with an inverted
    // state. this is pointless, and also computationally expensive. to
    // prevent this from happening, we use the rule that indexes with lo=hi=0
    // will never be checked for set changes. this means that the state for
    // these indexes may be incorrect, but that doesn't matter.

    // see if x(i),w(i) is in a valid region
    if (lo[i]==0 && w[i] >= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = false;
    }
    else if (hi[i]==0 && w[i] <= 0) {
      lcp.transfer_i_to_N (i);
      scratchMem.state[i] = true;
    }
    else if (w[i]==0) {
      // this is a degenerate case. by the time we get to this test we know
      // that lo != 0, which means that lo < 0 as lo is not allowed to be +ve,
      // and similarly that hi > 0. this means that the line segment
      // corresponding to set C is at least finite in extent, and we are on it.
      // NOTE: we must call lcp.solve1() before lcp.transfer_i_to_C()
      lcp.solve1 (&scratchMem.delta_x[0],i,0,1);

      lcp.transfer_i_to_C (i);
    }
    else {
      // we must push x(i) and w(i)
      for (;;) {
        int dir;
        btScalar dirf;
        // find direction to push on x(i)
        if (w[i] <= 0) {
          dir = 1;
          dirf = btScalar(1.0);
        }
        else {
          dir = -1;
          dirf = btScalar(-1.0);
        }

        // compute: delta_x(C) = -dir*A(C,C)\A(C,i)
        lcp.solve1 (&scratchMem.delta_x[0],i,dir);

        // note that delta_x[i] = dirf, but we wont bother to set it

        // compute: delta_w = A*delta_x ... note we only care about
        // delta_w(N) and delta_w(i), the rest is ignored
        lcp.pN_equals_ANC_times_qC (&scratchMem.delta_w[0],&scratchMem.delta_x[0]);
        lcp.pN_plusequals_ANi (&scratchMem.delta_w[0],i,dir);
        scratchMem.delta_w[i] = lcp.AiC_times_qC (i,&scratchMem.delta_x[0]) + lcp.Aii(i)*dirf;

        // find largest step we can take (size=s), either to drive x(i),w(i)
        // to the valid LCP region or to drive an already-valid variable
        // outside the valid region.

        int cmd = 1;		// index switching command
        int si = 0;		// si = index to switch if cmd>3
        btScalar s = -w[i]/scratchMem.delta_w[i];
        if (dir > 0) {
          if (hi[i] < BT_INFINITY) {
            btScalar s2 = (hi[i]-x[i])*dirf;	// was (hi[i]-x[i])/dirf	// step to x(i)=hi(i)
            if (s2 < s) {
              s = s2;
              cmd = 3;
            }
          }
        }
        else {
          if (lo[i] > -BT_INFINITY) {
            btScalar s2 = (lo[i]-x[i])*dirf;	// was (lo[i]-x[i])/dirf	// step to x(i)=lo(i)
            if (s2 < s) {
              s = s2;
              cmd = 2;
            }
          }
        }

        {
          const int numN = lcp.numN();
          for (int k=0; k < numN; ++k) {
            const int indexN_k = lcp.indexN(k);
            if (!scratchMem.state[indexN_k] ? scratchMem.delta_w[indexN_k] < 0 : scratchMem.delta_w[indexN_k] > 0) {
                // don't bother checking if lo=hi=0
                if (lo[indexN_k] == 0 && hi[indexN_k] == 0) continue;
                btScalar s2 = -w[indexN_k] / scratchMem.delta_w[indexN_k];
                if (s2 < s) {
                  s = s2;
                  cmd = 4;
                  si = indexN_k;
                }
            }
          }
        }

        {
          const int numC = lcp.numC();
          for (int k=adj_nub; k < numC; ++k) {
            const int indexC_k = lcp.indexC(k);
            if (scratchMem.delta_x[indexC_k] < 0 && lo[indexC_k] > -BT_INFINITY) {
              btScalar s2 = (lo[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 5;
                si = indexC_k;
              }
            }
            if (scratchMem.delta_x[indexC_k] > 0 && hi[indexC_k] < BT_INFINITY) {
              btScalar s2 = (hi[indexC_k]-x[indexC_k]) / scratchMem.delta_x[indexC_k];
              if (s2 < s) {
                s = s2;
                cmd = 6;
                si = indexC_k;
              }
            }
          }
        }

        //static char* cmdstring[8] = {0,"->C","->NL","->NH","N->C",
        //			     "C->NL","C->NH"};
        //printf ("cmd=%d (%s), si=%d\n",cmd,cmdstring[cmd],(cmd>3) ? si : i);

        // if s <= 0 then we've got a problem. if we just keep going then
        // we're going to get stuck in an infinite loop. instead, just cross
        // our fingers and exit with the current solution.
        if (s <= btScalar(0.0)) 
		{
//          printf("LCP internal error, s <= 0 (s=%.4e)",(double)s);
          if (i < n) {
            btSetZero (x+i,n-i);
            btSetZero (w+i,n-i);
          }
          s_error = true;
          break;
        }

        // apply x = x + s * delta_x
        lcp.pC_plusequals_s_times_qC (x, s, &scratchMem.delta_x[0]);
        x[i] += s * dirf;

        // apply w = w + s * delta_w
        lcp.pN_plusequals_s_times_qN (w, s, &scratchMem.delta_w[0]);
        w[i] += s * scratchMem.delta_w[i];

//        void *tmpbuf;
        // switch indexes between sets if necessary
        switch (cmd) {
        case 1:		// done
          w[i] = 0;
          lcp.transfer_i_to_C (i);
          break;
        case 2:		// done
          x[i] = lo[i];
          scratchMem.state[i] = false;
          lcp.transfer_i_to_N (i);
          break;
        case 3:		// done
          x[i] = hi[i];
          scratchMem.state[i] = true;
          lcp.transfer_i_to_N (i);
          break;
        case 4:		// keep going
          w[si] = 0;
          lcp.transfer_i_from_N_to_C (si);
          break;
        case 5:		// keep going
          x[si] = lo[si];
          scratchMem.state[si] = false;
		  lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        case 6:		// keep going
          x[si] = hi[si];
          scratchMem.state[si] = true;
          lcp.transfer_i_from_C_to_N (si, scratchMem.m_scratch);
          break;
        }

        if (cmd <= 3) break;
      } // for (;;)
    } // else

    if (s_error) 
	{
      break;
    }
  } // for (int i=adj_nub; i<n; ++i)

  lcp.unpermute();


  return !s_error;
}